

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

format_arg * __thiscall
fmt::v7::detail::
specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
::get_arg(format_arg *__return_storage_ptr__,
         specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
         *this,undefined8 param_3,int param_4)

{
  uint uVar1;
  basic_format_parse_context<char,_fmt::v7::detail::error_handler> *this_00;
  basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *this_01;
  
  this_00 = this->parse_context_;
  uVar1 = this_00->next_arg_id_;
  if (-1 < (int)uVar1) {
    this_01 = this->context_;
    this_00->next_arg_id_ = uVar1 + 1;
    get_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>,int>
              (__return_storage_ptr__,(detail *)this_01,
               (basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *)(ulong)uVar1,
               param_4);
    return __return_storage_ptr__;
  }
  error_handler::on_error
            ((error_handler *)this_00,"cannot switch from manual to automatic argument indexing");
}

Assistant:

FMT_CONSTEXPR format_arg get_arg(auto_id) {
    return detail::get_arg(context_, parse_context_.next_arg_id());
  }